

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::js::api::json::DecodePsbtInput::DecodePsbtInput(DecodePsbtInput *this,DecodePsbtInput *param_1)

{
  pointer pcVar1;
  
  (this->super_JsonClassBase<cfd::js::api::json::DecodePsbtInput>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodePsbtInput_00a8e298;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->ignore_items)._M_t,&(param_1->ignore_items)._M_t);
  (this->non_witness_utxo_hex_)._M_dataplus._M_p = (pointer)&(this->non_witness_utxo_hex_).field_2;
  pcVar1 = (param_1->non_witness_utxo_hex_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->non_witness_utxo_hex_,pcVar1,
             pcVar1 + (param_1->non_witness_utxo_hex_)._M_string_length);
  DecodeRawTransactionResponse::DecodeRawTransactionResponse
            (&this->non_witness_utxo_,&param_1->non_witness_utxo_);
  (this->witness_utxo_).super_JsonClassBase<cfd::js::api::json::DecodePsbtUtxo>._vptr_JsonClassBase
       = (_func_int **)&PTR__DecodePsbtUtxo_00a8e330;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->witness_utxo_).ignore_items._M_t,&(param_1->witness_utxo_).ignore_items._M_t);
  (this->witness_utxo_).amount_ = (param_1->witness_utxo_).amount_;
  DecodePsbtLockingScript::DecodePsbtLockingScript
            (&(this->witness_utxo_).script_pub_key_,&(param_1->witness_utxo_).script_pub_key_);
  std::
  vector<cfd::js::api::json::PsbtSignatureData,_std::allocator<cfd::js::api::json::PsbtSignatureData>_>
  ::vector(&(this->partial_signatures_).super_JsonVector<cfd::js::api::json::PsbtSignatureData>.
            super_vector<cfd::js::api::json::PsbtSignatureData,_std::allocator<cfd::js::api::json::PsbtSignatureData>_>
           ,&(param_1->partial_signatures_).super_JsonVector<cfd::js::api::json::PsbtSignatureData>.
             super_vector<cfd::js::api::json::PsbtSignatureData,_std::allocator<cfd::js::api::json::PsbtSignatureData>_>
          );
  (this->partial_signatures_).super_JsonVector<cfd::js::api::json::PsbtSignatureData>.
  _vptr_JsonVector = (_func_int **)&PTR__JsonVector_00a8e460;
  (this->sighash_)._M_dataplus._M_p = (pointer)&(this->sighash_).field_2;
  pcVar1 = (param_1->sighash_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->sighash_,pcVar1,pcVar1 + (param_1->sighash_)._M_string_length);
  PsbtScriptData::PsbtScriptData(&this->redeem_script_,&param_1->redeem_script_);
  PsbtScriptData::PsbtScriptData(&this->witness_script_,&param_1->witness_script_);
  std::vector<cfd::js::api::json::PsbtBip32Data,_std::allocator<cfd::js::api::json::PsbtBip32Data>_>
  ::vector(&(this->bip32_derivs_).super_JsonVector<cfd::js::api::json::PsbtBip32Data>.
            super_vector<cfd::js::api::json::PsbtBip32Data,_std::allocator<cfd::js::api::json::PsbtBip32Data>_>
           ,&(param_1->bip32_derivs_).super_JsonVector<cfd::js::api::json::PsbtBip32Data>.
             super_vector<cfd::js::api::json::PsbtBip32Data,_std::allocator<cfd::js::api::json::PsbtBip32Data>_>
          );
  (this->bip32_derivs_).super_JsonVector<cfd::js::api::json::PsbtBip32Data>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00a8e640;
  (this->final_scriptsig_).super_JsonClassBase<cfd::js::api::json::DecodeUnlockingScript>.
  _vptr_JsonClassBase = (_func_int **)&PTR__DecodeUnlockingScript_00a86348;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->final_scriptsig_).ignore_items._M_t,
             &(param_1->final_scriptsig_).ignore_items._M_t);
  (this->final_scriptsig_).asm__._M_dataplus._M_p = (pointer)&(this->final_scriptsig_).asm__.field_2
  ;
  pcVar1 = (param_1->final_scriptsig_).asm__._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->final_scriptsig_).asm__,pcVar1,
             pcVar1 + (param_1->final_scriptsig_).asm__._M_string_length);
  (this->final_scriptsig_).hex_._M_dataplus._M_p = (pointer)&(this->final_scriptsig_).hex_.field_2;
  pcVar1 = (param_1->final_scriptsig_).hex_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->final_scriptsig_).hex_,pcVar1,
             pcVar1 + (param_1->final_scriptsig_).hex_._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(this->final_scriptwitness_).
            super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,&(param_1->final_scriptwitness_).
             super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  (this->final_scriptwitness_).
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_JsonVector = (_func_int **)&PTR__JsonVector_00a863e0;
  std::vector<cfd::js::api::json::PsbtMapData,_std::allocator<cfd::js::api::json::PsbtMapData>_>::
  vector(&(this->unknown_).super_JsonVector<cfd::js::api::json::PsbtMapData>.
          super_vector<cfd::js::api::json::PsbtMapData,_std::allocator<cfd::js::api::json::PsbtMapData>_>
         ,&(param_1->unknown_).super_JsonVector<cfd::js::api::json::PsbtMapData>.
           super_vector<cfd::js::api::json::PsbtMapData,_std::allocator<cfd::js::api::json::PsbtMapData>_>
        );
  (this->unknown_).super_JsonVector<cfd::js::api::json::PsbtMapData>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00a8e0a0;
  return;
}

Assistant:

DecodePsbtInput() {
    CollectFieldName();
  }